

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpNode(Bone *this,Skeleton *skeleton,aiNode *parentNode)

{
  pointer puVar1;
  pointer puVar2;
  pointer ppBVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  aiNode *this_00;
  long lVar19;
  aiNode **ppaVar20;
  pointer ppBVar21;
  aiNode *paVar22;
  runtime_error *this_01;
  long lVar23;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00,&this->name);
  this_00->mParent = parentNode;
  fVar15 = (this->defaultPose).a1;
  fVar16 = (this->defaultPose).a2;
  fVar17 = (this->defaultPose).a3;
  fVar18 = (this->defaultPose).a4;
  fVar11 = (this->defaultPose).b1;
  fVar12 = (this->defaultPose).b2;
  fVar13 = (this->defaultPose).b3;
  fVar14 = (this->defaultPose).b4;
  fVar7 = (this->defaultPose).c1;
  fVar8 = (this->defaultPose).c2;
  fVar9 = (this->defaultPose).c3;
  fVar10 = (this->defaultPose).c4;
  fVar4 = (this->defaultPose).d2;
  fVar5 = (this->defaultPose).d3;
  fVar6 = (this->defaultPose).d4;
  (this_00->mTransformation).d1 = (this->defaultPose).d1;
  (this_00->mTransformation).d2 = fVar4;
  (this_00->mTransformation).d3 = fVar5;
  (this_00->mTransformation).d4 = fVar6;
  (this_00->mTransformation).c1 = fVar7;
  (this_00->mTransformation).c2 = fVar8;
  (this_00->mTransformation).c3 = fVar9;
  (this_00->mTransformation).c4 = fVar10;
  (this_00->mTransformation).b1 = fVar11;
  (this_00->mTransformation).b2 = fVar12;
  (this_00->mTransformation).b3 = fVar13;
  (this_00->mTransformation).b4 = fVar14;
  (this_00->mTransformation).a1 = fVar15;
  (this_00->mTransformation).a2 = fVar16;
  (this_00->mTransformation).a3 = fVar17;
  (this_00->mTransformation).a4 = fVar18;
  puVar1 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar19 = (long)puVar2 - (long)puVar1;
    lVar23 = lVar19 >> 1;
    this_00->mNumChildren = (uint)lVar23;
    ppaVar20 = (aiNode **)operator_new__(lVar19 * 4 & 0x7fffffff8);
    this_00->mChildren = ppaVar20;
    lVar19 = 0;
    do {
      ppBVar21 = (skeleton->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppBVar3 = (skeleton->bones).
                super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppBVar21 == ppBVar3) {
LAB_00462474:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ConvertToAssimpNode: Failed to find child bone ",0x2f);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," for parent ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length)
        ;
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_01,asStack_1c8);
        *(undefined ***)this_01 = &PTR__runtime_error_008bf448;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      while ((*ppBVar21)->id !=
             (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar19]) {
        ppBVar21 = ppBVar21 + 1;
        if (ppBVar21 == ppBVar3) goto LAB_00462474;
      }
      paVar22 = ConvertToAssimpNode(*ppBVar21,skeleton,this_00);
      this_00->mChildren[lVar19] = paVar22;
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar23 + (ulong)(lVar23 == 0));
  }
  return this_00;
}

Assistant:

aiNode *Bone::ConvertToAssimpNode(Skeleton *skeleton, aiNode *parentNode)
{
    // Bone node
    aiNode* node = new aiNode(name);
    node->mParent = parentNode;
    node->mTransformation = defaultPose;

    // Children
    if (!children.empty())
    {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        node->mChildren = new aiNode*[node->mNumChildren];

        for(size_t i=0, len=children.size(); i<len; ++i)
        {
            Bone *child = skeleton->BoneById(children[i]);
            if (!child) {
                throw DeadlyImportError(Formatter::format() << "ConvertToAssimpNode: Failed to find child bone " << children[i] << " for parent " << id << " " << name);
            }
            node->mChildren[i] = child->ConvertToAssimpNode(skeleton, node);
        }
    }
    return node;
}